

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *other)

{
  ulong uVar1;
  undefined1 *in_RSI;
  json_value *in_RDI;
  json_value *this_00;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 uVar2;
  object_t *in_stack_ffffffffffffffa0;
  json_value local_58;
  json_value local_50;
  json_value local_48;
  json_value local_40;
  json_value local_38;
  json_value local_30;
  json_value local_18;
  undefined1 *local_10;
  
  uVar2 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  in_RDI->object = (object_t *)0x0;
  in_RDI[1].object = (object_t *)0x0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  data::data((data *)0x21882a);
  this_00->boolean = (boolean_t)*local_10;
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_ffffffffffffffa0,(bool)uVar2);
  uVar1 = (ulong)this_00->boolean;
  switch(uVar1) {
  case 0:
  case 9:
    break;
  case 1:
    json_value::json_value(this_00,(object_t *)in_RDI);
    in_RDI[1] = local_18;
    break;
  case 2:
    json_value::json_value(this_00,(array_t *)in_RDI);
    in_RDI[1] = local_30;
    break;
  case 3:
    json_value::json_value(this_00,(string_t *)in_RDI);
    in_RDI[1] = local_38;
    break;
  case 4:
    json_value::json_value((json_value *)&local_40.boolean,(boolean_t)(local_10[8] & 1));
    in_RDI[1] = local_40;
    break;
  case 5:
    json_value::json_value((json_value *)&local_48.boolean,*(number_integer_t *)(local_10 + 8));
    in_RDI[1] = local_48;
    break;
  case 6:
    json_value::json_value((json_value *)&local_50.boolean,*(number_unsigned_t *)(local_10 + 8));
    in_RDI[1] = local_50;
    break;
  case 7:
    json_value::json_value((json_value *)&local_58.boolean,*(number_float_t *)(local_10 + 8));
    in_RDI[1] = local_58;
    break;
  case 8:
    json_value::json_value(this_00,(binary_t *)in_RDI);
    in_RDI[1].object = in_stack_ffffffffffffffa0;
  }
  uVar2 = (undefined1)(uVar1 >> 0x38);
  set_parents((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_RDI);
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_ffffffffffffffa0,(bool)uVar2);
  return;
}

Assistant:

basic_json(const basic_json& other)
: json_base_class_t(other)
{
m_data.m_type = other.m_data.m_type;
// check of passed value is valid
other.assert_invariant();

switch (m_data.m_type)
{
case value_t::object:
{
m_data.m_value = *other.m_data.m_value.object;
break;
}

case value_t::array:
{
m_data.m_value = *other.m_data.m_value.array;
break;
}

case value_t::string:
{
m_data.m_value = *other.m_data.m_value.string;
break;
}

case value_t::boolean:
{
m_data.m_value = other.m_data.m_value.boolean;
break;
}

case value_t::number_integer:
{
m_data.m_value = other.m_data.m_value.number_integer;
break;
}

case value_t::number_unsigned:
{
m_data.m_value = other.m_data.m_value.number_unsigned;
break;
}

case value_t::number_float:
{
m_data.m_value = other.m_data.m_value.number_float;
break;
}

case value_t::binary:
{
m_data.m_value = *other.m_data.m_value.binary;
break;
}

case value_t::null:
case value_t::discarded:
default:
break;
}

set_parents();
assert_invariant();
}